

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O0

bool __thiscall node::Warnings::Unset(Warnings *this,warning_type id)

{
  size_type sVar1;
  long in_FS_OFFSET;
  size_type success;
  CClientUIInterface *in_stack_ffffffffffffffb8;
  anon_class_16_2_e8808096 local_10;
  
  local_10.id = *(warning_type **)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffffb8);
  sVar1 = Unset::anon_class_16_2_e8808096::operator()(&local_10);
  if (sVar1 != 0) {
    CClientUIInterface::NotifyAlertChanged(in_stack_ffffffffffffffb8);
  }
  if (*(warning_type **)(in_FS_OFFSET + 0x28) == local_10.id) {
    return sVar1 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool Warnings::Unset(warning_type id)
{
    auto success{WITH_LOCK(m_mutex, return m_warnings.erase(id))};
    if (success) uiInterface.NotifyAlertChanged();
    return success;
}